

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_stream_socket.hpp
# Opt level: O0

size_t __thiscall
asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::write_some<asio::const_buffers_1>
          (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *this,const_buffers_1 *buffers)

{
  service_type *psVar1;
  size_t sVar2;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_RDI;
  error_code *unaff_retaddr;
  message_flags in_stack_0000000c;
  size_t s;
  error_code ec;
  error_code *in_stack_ffffffffffffffd0;
  error_code *err;
  
  CLI::std::error_code::error_code(in_stack_ffffffffffffffd0);
  psVar1 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(in_RDI);
  err = (error_code *)&psVar1->super_reactive_socket_service_base;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_implementation(in_RDI);
  sVar2 = asio::detail::reactive_socket_service_base::send<asio::const_buffers_1>
                    ((reactive_socket_service_base *)ec._M_cat,(base_implementation_type *)ec._0_8_,
                     (const_buffers_1 *)s,in_stack_0000000c,unaff_retaddr);
  asio::detail::throw_error(err,(char *)in_RDI);
  return sVar2;
}

Assistant:

std::size_t write_some(const ConstBufferSequence& buffers)
  {
    asio::error_code ec;
    std::size_t s = this->impl_.get_service().send(
        this->impl_.get_implementation(), buffers, 0, ec);
    asio::detail::throw_error(ec, "write_some");
    return s;
  }